

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadGLZSegs(FileReaderBase *data,int type)

{
  sector_t *psVar1;
  FileReaderBase *this;
  line_t *plVar2;
  uint local_44;
  line_t *ldef;
  BYTE side;
  DWORD DStack_30;
  WORD lineword;
  DWORD line;
  DWORD partner;
  DWORD v1;
  seg_t *seg;
  size_t j;
  int i;
  int type_local;
  FileReaderBase *data_local;
  
  j._4_4_ = type;
  _i = data;
  for (j._0_4_ = 0; (int)j < numsubsectors; j._0_4_ = (int)j + 1) {
    for (seg = (seg_t *)0x0; seg < (seg_t *)(ulong)subsectors[(int)j].numlines;
        seg = (seg_t *)((long)&seg->v1 + 1)) {
      this = FileReaderBase::operator>>(_i,&line);
      FileReaderBase::operator>>(this,&stack0xffffffffffffffd0);
      if (j._4_4_ < 2) {
        FileReaderBase::operator>>(_i,(WORD *)((long)&ldef + 2));
        if (ldef._2_2_ == 0xffff) {
          local_44 = 0xffffffff;
        }
        else {
          local_44 = (uint)ldef._2_2_;
        }
        ldef._4_4_ = local_44;
      }
      else {
        FileReaderBase::operator>>(_i,(DWORD *)((long)&ldef + 4));
      }
      FileReaderBase::operator>>(_i,(BYTE *)((long)&ldef + 1));
      _partner = subsectors[(int)j].firstline + (long)seg;
      _partner->v1 = vertexes + line;
      if (seg == (seg_t *)0x0) {
        _partner[subsectors[(int)j].numlines - 1].v2 = _partner->v1;
      }
      else {
        _partner[-1].v2 = _partner->v1;
      }
      glsegextras[((long)_partner - (long)segs) / 0x48].PartnerSeg = DStack_30;
      if (ldef._4_4_ == 0xffffffff) {
        _partner->linedef = (line_t *)0x0;
        _partner->sidedef = (side_t *)0x0;
        psVar1 = (subsectors[(int)j].firstline)->frontsector;
        _partner->backsector = psVar1;
        _partner->frontsector = psVar1;
      }
      else {
        plVar2 = lines + ldef._4_4_;
        _partner->linedef = plVar2;
        _partner->sidedef = plVar2->sidedef[ldef._1_1_];
        _partner->frontsector = plVar2->sidedef[ldef._1_1_]->sector;
        if (((plVar2->flags & 4) == 0) || (plVar2->sidedef[(int)(ldef._1_1_ ^ 1)] == (side_t *)0x0))
        {
          _partner->backsector = (sector_t *)0x0;
          plVar2->flags = plVar2->flags & 0xfffffffb;
        }
        else {
          _partner->backsector = plVar2->sidedef[(int)(ldef._1_1_ ^ 1)]->sector;
        }
      }
    }
  }
  return;
}

Assistant:

void P_LoadGLZSegs (FileReaderBase &data, int type)
{
	for (int i = 0; i < numsubsectors; ++i)
	{
		for (size_t j = 0; j < subsectors[i].numlines; ++j)
		{
			seg_t *seg;
			DWORD v1, partner;
			DWORD line;
			WORD lineword;
			BYTE side;

			data >> v1 >> partner;
			if (type >= 2)
			{
				data >> line;
			}
			else
			{
				data >> lineword;
				line = lineword == 0xFFFF ? 0xFFFFFFFF : lineword;
			}
			data >> side;

			seg = subsectors[i].firstline + j;
			seg->v1 = &vertexes[v1];
			if (j == 0)
			{
				seg[subsectors[i].numlines - 1].v2 = seg->v1;
			}
			else
			{
				seg[-1].v2 = seg->v1;
			}
			glsegextras[seg - segs].PartnerSeg = partner;
			if (line != 0xFFFFFFFF)
			{
				line_t *ldef;

				seg->linedef = ldef = &lines[line];
				seg->sidedef = ldef->sidedef[side];
				seg->frontsector = ldef->sidedef[side]->sector;
				if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
				{
					seg->backsector = ldef->sidedef[side^1]->sector;
				}
				else
				{
					seg->backsector = 0;
					ldef->flags &= ~ML_TWOSIDED;
				}
			}
			else
			{
				seg->linedef = NULL;
				seg->sidedef = NULL;
				seg->frontsector = seg->backsector = subsectors[i].firstline->frontsector;
			}
		}
	}
}